

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

void __thiscall re2::BitState::Push(BitState *this,int id,char *p)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  LogMessage *pLVar4;
  Job *pJVar5;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  Job *top;
  Job *top_1;
  int in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  BitState *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  LogMessage local_198;
  char *local_18;
  int local_c;
  
  iVar2 = *(int *)(in_RDI + 0x70);
  local_18 = in_RDX;
  local_c = in_ESI;
  iVar1 = PODArray<re2::Job>::size((PODArray<re2::Job> *)0x23223b);
  if (iVar1 <= iVar2) {
    GrowStack(in_stack_fffffffffffffe20);
    iVar2 = *(int *)(in_RDI + 0x70);
    iVar1 = PODArray<re2::Job>::size((PODArray<re2::Job> *)0x232268);
    if (iVar1 <= iVar2) {
      pLVar4 = &local_198;
      LogMessage::LogMessage
                ((LogMessage *)CONCAT44(iVar2,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28,
                 (int)((ulong)pLVar4 >> 0x20));
      poVar3 = LogMessage::stream(pLVar4);
      poVar3 = std::operator<<(poVar3,"GrowStack() failed: ");
      poVar3 = std::operator<<(poVar3,"njob_ = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x70));
      pLVar4 = (LogMessage *)std::operator<<(poVar3,", ");
      poVar3 = std::operator<<((ostream *)pLVar4,"job_.size() = ");
      iVar2 = PODArray<re2::Job>::size((PODArray<re2::Job> *)0x23232c);
      std::ostream::operator<<(poVar3,iVar2);
      LogMessage::~LogMessage(pLVar4);
      return;
    }
  }
  if ((((-1 < local_c) && (0 < *(int *)(in_RDI + 0x70))) &&
      (pJVar5 = PODArray<re2::Job>::operator[]
                          ((PODArray<re2::Job> *)
                           CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           in_stack_fffffffffffffdec), local_c == pJVar5->id)) &&
     (local_18 == pJVar5->p + (long)pJVar5->rle + 1)) {
    in_stack_fffffffffffffdf0 = pJVar5->rle;
    iVar2 = std::numeric_limits<int>::max();
    if (in_stack_fffffffffffffdf0 < iVar2) {
      pJVar5->rle = pJVar5->rle + 1;
      return;
    }
  }
  *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + 1;
  pJVar5 = PODArray<re2::Job>::operator[]
                     ((PODArray<re2::Job> *)
                      CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                      in_stack_fffffffffffffdec);
  pJVar5->id = local_c;
  pJVar5->rle = 0;
  pJVar5->p = local_18;
  return;
}

Assistant:

void BitState::Push(int id, const char* p) {
  if (njob_ >= job_.size()) {
    GrowStack();
    if (njob_ >= job_.size()) {
      LOG(DFATAL) << "GrowStack() failed: "
                  << "njob_ = " << njob_ << ", "
                  << "job_.size() = " << job_.size();
      return;
    }
  }

  // If id < 0, it's undoing a Capture,
  // so we mustn't interfere with that.
  if (id >= 0 && njob_ > 0) {
    Job* top = &job_[njob_-1];
    if (id == top->id &&
        p == top->p + top->rle + 1 &&
        top->rle < std::numeric_limits<int>::max()) {
      ++top->rle;
      return;
    }
  }

  Job* top = &job_[njob_++];
  top->id = id;
  top->rle = 0;
  top->p = p;
}